

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::NameResolver::OnDelegateExpr(NameResolver *this,TryExpr *expr)

{
  pointer pbVar1;
  pointer pcVar2;
  
  pbVar1 = (this->labels_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->labels_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
  pcVar2 = pbVar1[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &pbVar1[-1].field_2) {
    operator_delete(pcVar2,pbVar1[-1].field_2._M_allocated_capacity + 1);
  }
  ResolveLabelVar(this,&expr->delegate_target);
  return (Result)Ok;
}

Assistant:

Result NameResolver::OnDelegateExpr(TryExpr* expr) {
  // Pop the label here as a try-delegate has no `end` instruction.
  PopLabel();

  // We resolve *after* popping the label in order to ensure that the
  // delegate label starts counting after the current try-delegate.
  ResolveLabelVar(&expr->delegate_target);

  return Result::Ok;
}